

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O0

void __thiscall OB::Color::Color(Color *this,string *k,value fg)

{
  allocator<char> local_1d;
  value local_1c;
  string *psStack_18;
  value fg_local;
  string *k_local;
  Color *this_local;
  
  this->_valid = false;
  this->_fg = fg != bg;
  local_1c = fg;
  psStack_18 = k;
  k_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_key,"clear",&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  std::__cxx11::string::string((string *)&this->_value);
  this->_mode = null;
  (this->_hsl).h = 50.0;
  (this->_hsl).s = 50.0;
  (this->_hsl).l = 50.0;
  key(this,psStack_18);
  return;
}

Assistant:

Color(std::string const& k, Type::value const fg = Type::value::fg) :
    _fg {static_cast<bool>(fg)}
  {
    key(k);
  }